

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_EnumerateCallbackResult
enumerateFromMountPoint
          (DirHandle *i,char *arcfname,PHYSFS_EnumerateCallback callback,char *_fname,void *data)

{
  undefined8 uVar1;
  PHYSFS_EnumerateCallback p_Var2;
  PHYSFS_EnumerateCallbackResult PVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  char *pcVar6;
  PHYSFS_EnumerateCallback *pp_Var7;
  undefined1 *ptr;
  long lVar8;
  PHYSFS_EnumerateCallback local_38;
  
  pp_Var7 = &local_38;
  local_38 = callback;
  sVar4 = strlen(arcfname);
  sVar5 = strlen(i->mountPoint);
  if (sVar5 + 1 < 0x100) {
    pp_Var7 = (PHYSFS_EnumerateCallback *)((long)&local_38 - (sVar5 + 0x18 & 0xfffffffffffffff0));
    ptr = (undefined1 *)pp_Var7;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)((long)pp_Var7 + -8) = 0x108810;
  __dest = (char *)__PHYSFS_initSmallAlloc(ptr,sVar5 + 1);
  if (__dest == (char *)0x0) {
    *(undefined8 *)((long)pp_Var7 + -8) = 2;
  }
  else {
    pcVar6 = i->mountPoint;
    *(undefined8 *)((long)pp_Var7 + -8) = 0x108824;
    strcpy(__dest,pcVar6);
    lVar8 = sVar4 + 1;
    if (sVar4 == 0) {
      lVar8 = 0;
    }
    *(undefined8 *)((long)pp_Var7 + -8) = 0x2f;
    uVar1 = *(undefined8 *)((long)pp_Var7 + -8);
    *(undefined8 *)((long)pp_Var7 + -8) = 0x10883e;
    pcVar6 = strchr(__dest + lVar8,(int)uVar1);
    p_Var2 = local_38;
    if (pcVar6 == (char *)0x0) {
      *(code **)((long)pp_Var7 + -8) = verifyPath;
      __assert_fail("end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs.c"
                    ,0x922,
                    "PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *, const char *, PHYSFS_EnumerateCallback, const char *, void *)"
                   );
    }
    *pcVar6 = '\0';
    *(undefined8 *)((long)pp_Var7 + -8) = 0x108852;
    PVar3 = (*p_Var2)(data,_fname,__dest + lVar8);
    if (*(long *)(__dest + -8) != 0) {
      *(undefined8 *)((long)pp_Var7 + -8) = 0x108869;
      (*__PHYSFS_AllocatorHooks.Free)(__dest + -8);
    }
    if (PVar3 != PHYSFS_ENUM_ERROR) {
      return PVar3;
    }
    *(undefined8 *)((long)pp_Var7 + -8) = 0x1d;
  }
  uVar1 = *(undefined8 *)((long)pp_Var7 + -8);
  *(undefined8 *)((long)pp_Var7 + -8) = 0x10887b;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar1);
  *(undefined8 *)((long)pp_Var7 + -8) = 0xffffffffffffffff;
  return (PHYSFS_EnumerateCallbackResult)*(undefined8 *)((long)pp_Var7 + -8);
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *i,
                                    const char *arcfname,
                                    PHYSFS_EnumerateCallback callback,
                                    const char *_fname, void *data)
{
    PHYSFS_EnumerateCallbackResult retval;
    const size_t len = strlen(arcfname);
    char *ptr = NULL;
    char *end = NULL;
    const size_t slen = strlen(i->mountPoint) + 1;
    char *mountPoint = (char *) __PHYSFS_smallAlloc(slen);

    BAIL_IF(!mountPoint, PHYSFS_ERR_OUT_OF_MEMORY, PHYSFS_ENUM_ERROR);

    strcpy(mountPoint, i->mountPoint);
    ptr = mountPoint + ((len) ? len + 1 : 0);
    end = strchr(ptr, '/');
    assert(end);  /* should always find a terminating '/'. */
    *end = '\0';
    retval = callback(data, _fname, ptr);
    __PHYSFS_smallFree(mountPoint);

    BAIL_IF(retval == PHYSFS_ENUM_ERROR, PHYSFS_ERR_APP_CALLBACK, retval);
    return retval;
}